

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O2

bool __thiscall Turn::addNurse(Turn *this,NurseSolution *nurse)

{
  bool bVar1;
  NurseSolution *local_20;
  
  local_20 = nurse;
  bVar1 = hasNurse(this,nurse);
  if (!bVar1) {
    std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::push_back
              (&this->nurses,&local_20);
    NurseSolution::addTurn(local_20,this);
  }
  return !bVar1;
}

Assistant:

bool Turn::addNurse(NurseSolution * nurse){
    if(!hasNurse(nurse)) {
        nurses.push_back(nurse);
        nurse->addTurn(this);
        return true;
    }
    return false;
}